

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_writer::f_w_const<xray_re::xr_surface>>
          (xr_writer *this,
          vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_> *container,
          f_w_const<xray_re::xr_surface> write)

{
  pointer ppxVar1;
  code *pcVar2;
  long in_RCX;
  code *in_RDX;
  long *plVar3;
  pointer ppxVar4;
  
  ppxVar1 = (container->
            super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar4 = (container->
                 super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppxVar4 != ppxVar1; ppxVar4 = ppxVar4 + 1
      ) {
    plVar3 = (long *)((long)&(*ppxVar4)->_vptr_xr_surface + in_RCX);
    pcVar2 = in_RDX;
    if (((ulong)in_RDX & 1) != 0) {
      pcVar2 = *(code **)(in_RDX + *plVar3 + -1);
    }
    (*pcVar2)(plVar3,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}